

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.h
# Opt level: O0

Entity __thiscall entityx::EntityManager::create(EntityManager *this)

{
  Entity EVar1;
  bool bVar2;
  reference pvVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  uint32_t version;
  uint32_t index;
  Entity entity;
  Id local_28;
  undefined4 in_stack_ffffffffffffffe0;
  value_type version_00;
  undefined4 in_stack_ffffffffffffffe4;
  value_type index_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar4;
  EntityManager *in_stack_fffffffffffffff0;
  Id local_8;
  
  pvVar4 = in_RDI;
  bVar2 = Catch::clara::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  if (bVar2) {
    index_00 = *(value_type *)(in_RDI + 8);
    *(value_type *)(in_RDI + 8) = index_00 + 1;
    accomodate_entity(in_stack_fffffffffffffff0,(uint32_t)((ulong)pvVar4 >> 0x20));
    pvVar3 = Catch::clara::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (in_RDI + 0x60,(ulong)index_00);
    *pvVar3 = 1;
    version_00 = 1;
  }
  else {
    pvVar3 = Catch::clara::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back(in_RDI);
    index_00 = *pvVar3;
    Catch::clara::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::pop_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x2ad575);
    pvVar3 = Catch::clara::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (in_RDI + 0x60,(ulong)index_00);
    version_00 = *pvVar3;
  }
  Entity::Id::Id(&local_28,index_00,version_00);
  Entity::Entity((Entity *)&stack0xfffffffffffffff0,(EntityManager *)in_RDI,local_28);
  EventManager::emit<entityx::EntityCreatedEvent,entityx::Entity&>
            ((EventManager *)entity.id_.id_,(Entity *)entity.manager_);
  EVar1.id_.id_ = local_8.id_;
  EVar1.manager_ = in_stack_fffffffffffffff0;
  return EVar1;
}

Assistant:

Entity create() {
    uint32_t index, version;
    if (free_list_.empty()) {
      index = index_counter_++;
      accomodate_entity(index);
      version = entity_version_[index] = 1;
    } else {
      index = free_list_.back();
      free_list_.pop_back();
       version = entity_version_[index];
    }
    Entity entity(this, Entity::Id(index, version));
    event_manager_.emit<EntityCreatedEvent>(entity);
    return entity;
  }